

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::newAlignNode
          (BaseBuilder *this,AlignNode **out,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignMode local_5;
  uint local_4;
  
  *out = (AlignNode *)0x0;
  EVar1 = _newNodeT<asmjit::v1_14::AlignNode,asmjit::v1_14::AlignMode&,unsigned_int&>
                    (this,out,&local_5,&local_4);
  return EVar1;
}

Assistant:

Error BaseBuilder::newAlignNode(AlignNode** out, AlignMode alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}